

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

int cmcmd::VisualStudioLink
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,int type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  _func_int **pp_Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer __x;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmConsoleBuf consoleBuf;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmVSLink vsLink;
  cmConsoleBuf local_27d;
  int local_27c;
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  undefined8 local_238;
  pointer local_230;
  pointer pbStack_228;
  pointer local_220;
  pointer pbStack_218;
  pointer local_210;
  pointer pbStack_208;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [16];
  
  cmConsoleBuf::cmConsoleBuf(&local_27d);
  iVar7 = -1;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    bVar5 = cmsys::SystemTools::HasEnv("VERBOSE");
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__x != pbVar2) {
      paVar1 = &local_278.field_2;
      local_27c = type;
      do {
        pbVar3 = (pointer)(__x->_M_dataplus)._M_p;
        if (*(char *)&(pbVar3->_M_dataplus)._M_p == '@') {
          local_238 = (_func_int **)__x->_M_string_length;
          __str._M_str = "@CMakeFiles";
          __str._M_len = 0xb;
          local_230 = pbVar3;
          iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,0,0xb,
                             __str);
          if (iVar7 == 0) goto LAB_0019bf44;
          std::__cxx11::string::substr((ulong)&local_278,(ulong)__x);
          std::ifstream::ifstream((istream *)&local_238,local_278._M_dataplus._M_p,_S_in);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar1) {
            operator_delete(local_278._M_dataplus._M_p,
                            CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                     local_278.field_2._M_local_buf[0]) + 1);
          }
          local_278._M_string_length = 0;
          local_278.field_2._M_local_buf[0] = '\0';
          local_278._M_dataplus._M_p = (pointer)paVar1;
          while (bVar6 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)&local_238,&local_278,(bool *)0x0,0xffffffffffffffff)
                , bVar6) {
            cmSystemTools::ParseWindowsCommandLine(local_278._M_dataplus._M_p,&local_258);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar1) {
            operator_delete(local_278._M_dataplus._M_p,
                            CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                     local_278.field_2._M_local_buf[0]) + 1);
          }
          std::ifstream::~ifstream((istream *)&local_238);
        }
        else {
LAB_0019bf44:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_258,__x);
        }
        __x = __x + 1;
        type = local_27c;
      } while (__x != pbVar2);
    }
    pp_Var4 = local_238;
    local_200._M_p = (pointer)&local_1f0;
    local_238._7_1_ = SUB81(pp_Var4,7);
    local_238._0_7_ = CONCAT25(0x100,CONCAT14(bVar5,type));
    local_230 = (pointer)0x0;
    pbStack_228 = (pointer)0x0;
    local_220 = (pointer)0x0;
    pbStack_218 = (pointer)0x0;
    local_210 = (pointer)0x0;
    pbStack_208 = (pointer)0x0;
    local_1f8 = 0;
    local_1f0._M_local_buf[0] = '\0';
    local_1e0._M_p = (pointer)&local_1d0;
    local_1d8 = 0;
    local_1d0._M_local_buf[0] = '\0';
    local_1c0._M_p = (pointer)&local_1b0;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    local_1a0._M_p = (pointer)&local_190;
    local_198 = 0;
    local_190._M_local_buf[0] = '\0';
    local_180._M_p = (pointer)&local_170;
    local_178 = 0;
    local_170._M_local_buf[0] = '\0';
    local_160._M_p = (pointer)&local_150;
    local_158 = 0;
    local_150._M_local_buf[0] = '\0';
    local_140._M_p = (pointer)local_130;
    local_138 = 0;
    local_130[0]._M_local_buf[0] = '\0';
    bVar5 = cmVSLink::Parse((cmVSLink *)&local_238,
                            local_258.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2,
                            (const_iterator)
                            local_258.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    iVar7 = -1;
    if (bVar5) {
      iVar7 = cmVSLink::Link((cmVSLink *)&local_238);
    }
    cmVSLink::~cmVSLink((cmVSLink *)&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
  }
  return iVar7;
}

Assistant:

int cmcmd::VisualStudioLink(std::vector<std::string> const& args, int type)
{
  // Replace streambuf so we output in the system codepage. CMake is set up
  // to output in Unicode (see SetUTF8Pipes) but the Visual Studio linker
  // outputs using the system codepage so we need to change behavior when
  // we run the link command.
  cmConsoleBuf consoleBuf;

  if (args.size() < 2) {
    return -1;
  }
  const bool verbose = cmSystemTools::HasEnv("VERBOSE");
  std::vector<std::string> expandedArgs;
  for (std::string const& i : args) {
    // check for nmake temporary files
    if (i[0] == '@' && !cmHasLiteralPrefix(i, "@CMakeFiles")) {
      cmsys::ifstream fin(i.substr(1).c_str());
      std::string line;
      while (cmSystemTools::GetLineFromStream(fin, line)) {
        cmSystemTools::ParseWindowsCommandLine(line.c_str(), expandedArgs);
      }
    } else {
      expandedArgs.push_back(i);
    }
  }

  cmVSLink vsLink(type, verbose);
  if (!vsLink.Parse(expandedArgs.begin() + 2, expandedArgs.end())) {
    return -1;
  }
  return vsLink.Link();
}